

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

Value * __thiscall
kj::_::Debug::
ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++:1004:5)>
::evaluate(Value *__return_storage_ptr__,
          ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_test_c__:1004:5)>
          *this)

{
  Array<char> local_28;
  
  makeDescription<unsigned_int&>((Debug *)&local_28,"step",(StringPtr *)this->func->step);
  __return_storage_ptr__->file =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
  ;
  __return_storage_ptr__->line[0] = -0x14;
  __return_storage_ptr__->line[1] = '\x03';
  __return_storage_ptr__->line[2] = '\0';
  __return_storage_ptr__->line[3] = '\0';
  *(char **)__return_storage_ptr__->description = local_28.ptr;
  *(size_t *)&__return_storage_ptr__->field_0x18 = local_28.size_;
  *(ArrayDisposer **)&__return_storage_ptr__->field_0x20 = local_28.disposer;
  local_28.ptr = (char *)0x0;
  local_28.size_ = 0;
  Array<char>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Value evaluate() override {
      return func();
    }